

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

void ignorableWhitespaceDebug(void *ctx,xmlChar *ch,int len)

{
  int local_4c;
  xmlChar local_48 [4];
  int i;
  char output [40];
  int len_local;
  xmlChar *ch_local;
  void *ctx_local;
  
  callbacks = callbacks + 1;
  if (quiet == 0) {
    output._36_4_ = len;
    for (local_4c = 0; local_4c < (int)output._36_4_ && local_4c < 0x1e; local_4c = local_4c + 1) {
      local_48[local_4c] = ch[local_4c];
    }
    local_48[local_4c] = '\0';
    fprintf((FILE *)SAXdebug,"SAX.ignorableWhitespace(%s, %d)\n",local_48,(ulong)(uint)output._36_4_
           );
  }
  return;
}

Assistant:

static void
ignorableWhitespaceDebug(void *ctx ATTRIBUTE_UNUSED, const xmlChar *ch, int len)
{
    char output[40];
    int i;

    callbacks++;
    if (quiet)
	return;
    for (i = 0;(i<len) && (i < 30);i++)
	output[i] = (char) ch[i];
    output[i] = 0;
    fprintf(SAXdebug, "SAX.ignorableWhitespace(%s, %d)\n", output, len);
}